

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void pulse_prog_pillar_zap(OBJ_DATA *obj,bool isTick)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  long in_RDI;
  __type_conflict2 _Var4;
  bool found;
  ROOM_INDEX_DATA *room;
  CHAR_DATA *mob_next;
  CHAR_DATA *mob;
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffeda8;
  void *in_stack_ffffffffffffedb0;
  void *arg1;
  CHAR_DATA *in_stack_ffffffffffffedb8;
  char *in_stack_ffffffffffffedc0;
  long local_1220;
  char local_1218 [167];
  undefined1 in_stack_ffffffffffffee8f;
  CHAR_DATA *in_stack_ffffffffffffee90;
  
  bVar3 = false;
  lVar1 = *(long *)(in_RDI + 0x58);
  if ((lVar1 != 0) && (*(long *)(lVar1 + 0x18) != 0)) {
    for (local_1220 = *(long *)(lVar1 + 0x18); local_1220 != 0;
        local_1220 = *(long *)(local_1220 + 8)) {
      bVar2 = is_npc(in_stack_ffffffffffffeda8);
      if (bVar2) {
        in_stack_ffffffffffffedc0 = *(char **)(local_1220 + 0x180);
        _Var4 = std::pow<int,int>(0,0x6665a7);
        if (((ulong)in_stack_ffffffffffffedc0 & (long)_Var4) == 0) {
          in_stack_ffffffffffffedb8 = *(CHAR_DATA **)(local_1220 + 0x280);
          _Var4 = std::pow<int,int>(0,0x6665da);
          if (((ulong)in_stack_ffffffffffffedb8 & (long)_Var4) == 0) goto LAB_006665f4;
        }
        bVar3 = true;
        break;
      }
LAB_006665f4:
    }
    if (bVar3) {
      sprintf(local_1218,
              "\x1b[1;34mThe pillars crackle suddenly with raw energy and emit a beam of blinding light!\x1b[0m"
             );
      act(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,in_stack_ffffffffffffedb0,
          in_stack_ffffffffffffeda8,0);
      lVar1 = *(long *)(lVar1 + 0x18);
LAB_00666656:
      do {
        local_1220 = lVar1;
        if (local_1220 == 0) {
          return;
        }
        lVar1 = *(long *)(local_1220 + 8);
        bVar3 = is_npc(in_stack_ffffffffffffeda8);
      } while (!bVar3);
      arg1 = *(void **)(local_1220 + 0x180);
      _Var4 = std::pow<int,int>(0,0x6666a3);
      if (((ulong)arg1 & (long)_Var4) == 0) goto code_r0x006666b6;
      goto LAB_006666e7;
    }
  }
  return;
code_r0x006666b6:
  in_stack_ffffffffffffeda8 = *(CHAR_DATA **)(local_1220 + 0x280);
  _Var4 = std::pow<int,int>(0,0x6666d5);
  if (((ulong)in_stack_ffffffffffffeda8 & (long)_Var4) != 0) {
LAB_006666e7:
    act(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,arg1,in_stack_ffffffffffffeda8,0);
    extract_char(in_stack_ffffffffffffee90,(bool)in_stack_ffffffffffffee8f);
  }
  goto LAB_00666656;
}

Assistant:

void pulse_prog_pillar_zap(OBJ_DATA *obj, bool isTick)
{
	char buf[MSL];
	CHAR_DATA *mob, *mob_next;
	ROOM_INDEX_DATA *room;
	bool found= false;

	if ((room = obj->in_room) == nullptr)
		return;

	if (!room->people)
		return;

	for (mob = room->people; mob; mob = mob->next_in_room)
	{
		if (is_npc(mob) && (IS_SET(mob->act, ACT_UNDEAD) || IS_SET(mob->form, FORM_UNDEAD)))
		{
			found = true;
			break;
		}
	}

	if (!found)
		return;

	sprintf(buf, "\x01B[1;34mThe pillars crackle suddenly with raw energy and emit a beam of blinding light!\x01B[0m");

	act(buf, room->people, 0, 0, TO_ALL);

	for (mob = room->people; mob; mob = mob_next)
	{
		mob_next = mob->next_in_room;

		if (is_npc(mob) && (IS_SET(mob->act, ACT_UNDEAD) || IS_SET(mob->form, FORM_UNDEAD)))
		{
			act("$n dissolves into dust as the shining blue light sweeps over it!", mob, 0, 0, TO_ROOM);
			extract_char(mob, true);
		}
	}
}